

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  pointer puVar1;
  pointer puVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  pointer puVar6;
  string *psVar7;
  ostream *poVar8;
  cmLocalUnixMakefileGenerator3 *this_01;
  pointer puVar9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmAlphaNum local_198;
  cmLocalUnixMakefileGenerator3 *local_168;
  string localName;
  string makefileName;
  cmAlphaNum local_100;
  string name;
  string local_b0;
  string makeTargetName;
  string tmp;
  string local_50;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_100);
  bVar3 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if (!bVar3) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    this_01 = (cmLocalUnixMakefileGenerator3 *)
              (puVar6->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar2 = *(pointer *)
              &((GeneratorTargetVector *)((long)&this_01->super_cmLocalCommonGenerator + 0x150))->
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
    ;
    local_168 = this_01;
    for (puVar9 = *(pointer *)
                   &((GeneratorTargetVector *)((long)&this_01->super_cmLocalCommonGenerator + 0x148)
                    )->
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
        ; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((puVar9->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                          .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      std::__cxx11::string::string((string *)&name,(string *)psVar7);
      if (name._M_string_length != 0) {
        pVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)emitted,&name);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bVar4 = cmGeneratorTarget::IsInBuildSystem
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (bVar4) {
            TVar5 = cmGeneratorTarget::GetType
                              ((puVar9->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            if (TVar5 != GLOBAL_TARGET) {
              cmLocalUnixMakefileGenerator3::WriteDivider(this_01,ruleFileStream);
              poVar8 = std::operator<<(ruleFileStream,"# Target rules for targets named ");
              poVar8 = std::operator<<(poVar8,(string *)&name);
              std::operator<<(poVar8,"\n\n");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&commands);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&tmp,"CMakeFiles/Makefile2",(allocator<char> *)&local_198);
              cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                        ((string *)&local_198,this_01,&tmp,&name);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &commands,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_198);
              std::__cxx11::string::~string((string *)&local_198);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&depends);
              if (!bVar3) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[25]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &depends,(char (*) [25])"cmake_check_build_system");
              }
              cmLocalUnixMakefileGenerator3::WriteMakeRule
                        (this_01,ruleFileStream,"Build rule for target.",&name,&depends,&commands,
                         true,false);
              cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                        (&localName,this_01,
                         (puVar9->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
              makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
              makefileName._M_string_length = 0;
              makefileName.field_2._M_local_buf[0] = '\0';
              local_198.View_._M_len = localName._M_string_length;
              local_198.View_._M_str = localName._M_dataplus._M_p;
              local_100.View_._M_len = 0xb;
              local_100.View_._M_str = "/build.make";
              cmStrCat<>(&makeTargetName,&local_198,&local_100);
              std::__cxx11::string::operator=((string *)&makefileName,(string *)&makeTargetName);
              std::__cxx11::string::~string((string *)&makeTargetName);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&depends);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&commands);
              local_198.View_._M_len = localName._M_string_length;
              local_198.View_._M_str = localName._M_dataplus._M_p;
              local_100.View_._M_len = 6;
              local_100.View_._M_str = "/build";
              cmStrCat<>(&makeTargetName,&local_198,&local_100);
              local_198.View_._M_len = name._M_string_length;
              local_198.View_._M_str = name._M_dataplus._M_p;
              local_100.View_._M_len = 5;
              local_100.View_._M_str = "/fast";
              cmStrCat<>(&local_50,&local_198,&local_100);
              std::__cxx11::string::operator=((string *)&localName,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              this_01 = local_168;
              cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                        ((string *)&local_198,local_168,&makefileName,&makeTargetName);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &commands,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_198);
              std::__cxx11::string::~string((string *)&local_198);
              cmLocalUnixMakefileGenerator3::WriteMakeRule
                        (this_01,ruleFileStream,"fast build rule for target.",&localName,&depends,
                         &commands,true,false);
              this_00 = (puVar9->_M_t).
                        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                        .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
              cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_((string *)&local_198,this_01);
              bVar4 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,(string *)&local_198);
              std::__cxx11::string::~string((string *)&local_198);
              if (bVar4) {
                cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                          (&local_b0,this_01,
                           (puVar9->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
                local_198.View_._M_len = local_b0._M_string_length;
                local_198.View_._M_str = local_b0._M_dataplus._M_p;
                local_100.View_._M_len = 0xb;
                local_100.View_._M_str = "/preinstall";
                cmStrCat<>(&local_50,&local_198,&local_100);
                std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_b0);
                local_198.View_._M_len = name._M_string_length;
                local_198.View_._M_str = name._M_dataplus._M_p;
                local_100.View_._M_len = 0xb;
                local_100.View_._M_str = "/preinstall";
                cmStrCat<>(&local_50,&local_198,&local_100);
                std::__cxx11::string::operator=((string *)&localName,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&depends);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&commands);
                this_01 = local_168;
                cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                          ((string *)&local_198,local_168,&makefileName,&makeTargetName);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &commands,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_198);
                std::__cxx11::string::~string((string *)&local_198);
                cmLocalUnixMakefileGenerator3::WriteMakeRule
                          (this_01,ruleFileStream,"Manual pre-install relink rule for target.",
                           &localName,&depends,&commands,true,false);
              }
              std::__cxx11::string::~string((string *)&makeTargetName);
              std::__cxx11::string::~string((string *)&makefileName);
              std::__cxx11::string::~string((string *)&localName);
              std::__cxx11::string::~string((string *)&tmp);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules(
  std::ostream& ruleFileStream, std::set<std::string>& emitted)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // write the target convenience rules
  for (const auto& localGen : this->LocalGenerators) {
    auto& lg =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen);
    // for each target Generate the rule files for each target.
    for (const auto& gtarget : lg.GetGeneratorTargets()) {
      // Don't emit the same rule twice (e.g. two targets with the same
      // simple name)
      std::string name = gtarget->GetName();
      if (!name.empty() && emitted.insert(name).second &&
          // Handle user targets here.  Global targets are handled in
          // the local generator on a per-directory basis.
          (gtarget->IsInBuildSystem() &&
           gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
        // Add a rule to build the target by name.
        lg.WriteDivider(ruleFileStream);
        ruleFileStream << "# Target rules for targets named " << name
                       << "\n\n";

        // Write the rule.
        commands.clear();
        std::string tmp = "CMakeFiles/Makefile2";
        commands.push_back(lg.GetRecursiveMakeCall(tmp, name));
        depends.clear();
        if (regenerate) {
          depends.emplace_back("cmake_check_build_system");
        }
        lg.WriteMakeRule(ruleFileStream, "Build rule for target.", name,
                         depends, commands, true);

        // Add a fast rule to build the target
        std::string localName = lg.GetRelativeTargetDirectory(gtarget.get());
        std::string makefileName;
        makefileName = cmStrCat(localName, "/build.make");
        depends.clear();
        commands.clear();
        std::string makeTargetName = cmStrCat(localName, "/build");
        localName = cmStrCat(name, "/fast");
        commands.push_back(
          lg.GetRecursiveMakeCall(makefileName, makeTargetName));
        lg.WriteMakeRule(ruleFileStream, "fast build rule for target.",
                         localName, depends, commands, true);

        // Add a local name for the rule to relink the target before
        // installation.
        if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
          makeTargetName = cmStrCat(
            lg.GetRelativeTargetDirectory(gtarget.get()), "/preinstall");
          localName = cmStrCat(name, "/preinstall");
          depends.clear();
          commands.clear();
          commands.push_back(
            lg.GetRecursiveMakeCall(makefileName, makeTargetName));
          lg.WriteMakeRule(ruleFileStream,
                           "Manual pre-install relink rule for target.",
                           localName, depends, commands, true);
        }
      }
    }
  }
}